

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolarizableAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::PolarizableAtomTypesSectionParser::parseLine
          (PolarizableAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  AtomType *pAVar3;
  RealType polarizability;
  string atomTypeName;
  PolarizableAdapter fca;
  StringTokenizer tokenizer;
  string local_a0;
  PolarizableAdapter local_80;
  StringTokenizer local_78;
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_78,line,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_78);
  if (iVar2 < 2) {
    snprintf(painCave.errMsg,2000,
             "PolarizableAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_a0,&local_78);
    pAVar3 = ForceField::getAtomType(ff,&local_a0);
    if (pAVar3 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "PolarizableAtomTypesSectionParser Error: Can not find matching AtomType at line %d\n"
               ,(ulong)(uint)lineNo);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_80.at_ = pAVar3;
      polarizability = StringTokenizer::nextTokenAsDouble(&local_78);
      PolarizableAdapter::makePolarizable(&local_80,polarizability);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.delim_._M_dataplus._M_p != &local_78.delim_.field_2) {
    operator_delete(local_78.delim_._M_dataplus._M_p,
                    local_78.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.tokenString_._M_dataplus._M_p != &local_78.tokenString_.field_2) {
    operator_delete(local_78.tokenString_._M_dataplus._M_p,
                    local_78.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PolarizableAtomTypesSectionParser::parseLine(ForceField& ff,
                                                    const std::string& line,
                                                    int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PolarizableAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        PolarizableAdapter fca  = PolarizableAdapter(atomType);
        RealType polarizability = tokenizer.nextTokenAsDouble();
        fca.makePolarizable(polarizability);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "PolarizableAtomTypesSectionParser Error: "
                 "Can not find matching AtomType at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
    }
  }